

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O3

void integer_suite::test_int16_one(void)

{
  int value;
  value_type input [3];
  iarchive in;
  int local_b4;
  uchar local_b0 [4];
  undefined4 local_ac;
  iarchive local_a8;
  
  local_b0[2] = '\0';
  local_b0[0] = 0xb2;
  local_b0[1] = '\x01';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[3]>(&local_a8,(uchar (*) [3])local_b0)
  ;
  local_b4 = 99;
  trial::protocol::bintoken::iarchive::load<int>(&local_a8,&local_b4);
  local_ac = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x7a,"void integer_suite::test_int16_one()",&local_b4,&local_ac);
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void test_int16_one()
{
    const value_type input[] = { token::code::int16, 0x01, 0x00 };
    format::iarchive in(input);
    int value = 99;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, 1);
}